

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ExtractCompoundObject
               (SnapObject *sobj,RecyclableObject *obj,bool isWellKnown,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap,
               SlabAllocator *alloc)

{
  bool bVar1;
  BOOL BVar2;
  TypeId TVar3;
  RecyclableObject **ppRVar4;
  ScriptContext *pSVar5;
  Type *pTVar6;
  SnapType **ppSVar7;
  char16 *local_50;
  int local_44;
  Type *objType;
  TTD_WELLKNOWN_TOKEN lookupToken;
  SlabAllocator *alloc_local;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*> *idToTypeMap_local;
  DynamicObject *pDStack_18;
  bool isWellKnown_local;
  RecyclableObject *obj_local;
  SnapObject *sobj_local;
  
  pDStack_18 = (DynamicObject *)obj;
  obj_local = (RecyclableObject *)sobj;
  BVar2 = Js::RecyclableObject::IsExternal(obj);
  if (BVar2 != 0) {
    TTDAbort_unrecoverable_error("We are not prepared for custom external objects yet");
  }
  ppRVar4 = Memory::PointerValue<Js::RecyclableObject>
                      ((RecyclableObject **)&stack0xffffffffffffffe8);
  (obj_local->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)*ppRVar4;
  TVar3 = Js::RecyclableObject::GetTypeId(&pDStack_18->super_RecyclableObject);
  if (TVar3 == TypeIds_AwaitObject) {
    local_44 = 0x26;
  }
  else {
    local_44 = (*(pDStack_18->super_RecyclableObject).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x5f])();
  }
  *(int *)&(obj_local->type).ptr = local_44;
  if (isWellKnown) {
    pSVar5 = Js::RecyclableObject::GetScriptContext(&pDStack_18->super_RecyclableObject);
    local_50 = RuntimeContextInfo::ResolvePathForKnownObject
                         (pSVar5->TTDWellKnownInfo,&pDStack_18->super_RecyclableObject);
  }
  else {
    local_50 = (char16 *)0x0;
  }
  pTVar6 = (Type *)SlabAllocatorBase<0>::CopyRawNullTerminatedStringInto(alloc,local_50);
  obj_local[1].type.ptr = pTVar6;
  pTVar6 = Js::RecyclableObject::GetType(&pDStack_18->super_RecyclableObject);
  ppSVar7 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::LookupKnownItem
                      (idToTypeMap,(unsigned_long)pTVar6);
  obj_local[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)*ppSVar7;
  TVar3 = Js::Type::GetTypeId(pTVar6);
  bVar1 = Js::StaticType::Is(TVar3);
  if (bVar1) {
    StdPropertyExtract_StaticType((SnapObject *)obj_local,&pDStack_18->super_RecyclableObject);
  }
  else {
    StdPropertyExtract_DynamicType((SnapObject *)obj_local,pDStack_18,alloc);
  }
  if (*(int *)&(obj_local->type).ptr != 0x26) {
    (*(pDStack_18->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x60])(pDStack_18,obj_local,alloc);
  }
  return;
}

Assistant:

void ExtractCompoundObject(NSSnapObjects::SnapObject* sobj, Js::RecyclableObject* obj, bool isWellKnown, const TTDIdentifierDictionary<TTD_PTR_ID, NSSnapType::SnapType*>& idToTypeMap, SlabAllocator& alloc)
        {
            TTDAssert(!obj->IsExternal(), "We are not prepared for custom external objects yet");

            sobj->ObjectPtrId = TTD_CONVERT_VAR_TO_PTR_ID(obj);
            sobj->SnapObjectTag = obj->GetTypeId() == Js::TypeId::TypeIds_AwaitObject ? SnapObjectType::SnapAwaitObject : obj->GetSnapTag_TTD();

            TTD_WELLKNOWN_TOKEN lookupToken = isWellKnown ? obj->GetScriptContext()->TTDWellKnownInfo->ResolvePathForKnownObject(obj) : TTD_INVALID_WELLKNOWN_TOKEN;
            sobj->OptWellKnownToken = alloc.CopyRawNullTerminatedStringInto(lookupToken);

            Js::Type* objType = obj->GetType();
            sobj->SnapType = idToTypeMap.LookupKnownItem(TTD_CONVERT_TYPEINFO_TO_PTR_ID(objType));

#if ENABLE_OBJECT_SOURCE_TRACKING
            InitializeDiagnosticOriginInformation(sobj->DiagOriginInfo);
#endif

            if(Js::StaticType::Is(objType->GetTypeId()))
            {
                NSSnapObjects::StdPropertyExtract_StaticType(sobj, obj);
            }
            else
            {
                NSSnapObjects::StdPropertyExtract_DynamicType(sobj, static_cast<Js::DynamicObject*>(obj), alloc);
            }

            if (sobj->SnapObjectTag != SnapObjectType::SnapAwaitObject)
            {
                obj->ExtractSnapObjectDataInto(sobj, alloc);
            }
        }